

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

int enet_peer_throttle(ENetPeer *peer,enet_uint32 rtt)

{
  enet_uint32 rtt_local;
  ENetPeer *peer_local;
  
  if (peer->lastRoundTripTimeVariance < peer->lastRoundTripTime) {
    if (rtt <= peer->lastRoundTripTime) {
      peer->packetThrottle = peer->packetThrottleAcceleration + peer->packetThrottle;
      if (peer->packetThrottleLimit < peer->packetThrottle) {
        peer->packetThrottle = peer->packetThrottleLimit;
      }
      return 1;
    }
    if (peer->lastRoundTripTime + peer->lastRoundTripTimeVariance * 2 < rtt) {
      if (peer->packetThrottleDeceleration < peer->packetThrottle) {
        peer->packetThrottle = peer->packetThrottle - peer->packetThrottleDeceleration;
      }
      else {
        peer->packetThrottle = 0;
      }
      return -1;
    }
  }
  else {
    peer->packetThrottle = peer->packetThrottleLimit;
  }
  return 0;
}

Assistant:

int
enet_peer_throttle (ENetPeer * peer, enet_uint32 rtt)
{
    if (peer -> lastRoundTripTime <= peer -> lastRoundTripTimeVariance)
    {
        peer -> packetThrottle = peer -> packetThrottleLimit;
    }
    else
    if (rtt <= peer -> lastRoundTripTime)
    {
        peer -> packetThrottle += peer -> packetThrottleAcceleration;

        if (peer -> packetThrottle > peer -> packetThrottleLimit)
          peer -> packetThrottle = peer -> packetThrottleLimit;

        return 1;
    }
    else
    if (rtt > peer -> lastRoundTripTime + 2 * peer -> lastRoundTripTimeVariance)
    {
        if (peer -> packetThrottle > peer -> packetThrottleDeceleration)
          peer -> packetThrottle -= peer -> packetThrottleDeceleration;
        else
          peer -> packetThrottle = 0;

        return -1;
    }

    return 0;
}